

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<8,454>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<8,454> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  double awr;
  double dVar1;
  int in_stack_ffffffffffffffa8;
  vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  local_40;
  
  awr = *(double *)(head + 0x20);
  dVar1 = *(double *)(head + 0x28);
  readSequence<njoy::ENDFtk::section::FissionYieldData,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_40,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,8,0x1c6,*(int *)(head + 0x18),
             in_stack_ffffffffffffffa8);
  dVar1 = round(dVar1);
  Type<8,_454>::Type((Type<8,_454> *)this,(int)dVar1,awr,&local_40);
  std::
  vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  ::~vector(&local_40);
  BaseWithoutMT<njoy::ENDFtk::section::Type<8,454>>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,8);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try : Type( head.ZA(), head.AWR(),
              readSequence< FissionYieldData >( begin, end, lineNumber,
                                                MAT, 8, 454, head.L1() ) ) {
    readSEND(begin, end, lineNumber, MAT, 8 );
  } catch ( std::exception& e ) {
    Log::info( "Trouble while reading section 454 of File 8 of Material {}",
               MAT );
    throw e;
  }